

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::XmlReporter::sectionStarting(XmlReporter *this,SectionInfo *sectionInfo)

{
  int iVar1;
  XmlWriter *this_00;
  long in_RDI;
  StringRef attribute;
  StringRef SVar2;
  SectionInfo *in_stack_ffffffffffffff58;
  StreamingReporterBase *in_stack_ffffffffffffff60;
  string *in_stack_ffffffffffffff68;
  SourceLineInfo *in_stack_ffffffffffffff88;
  XmlReporter *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  StringRef in_stack_ffffffffffffffb8;
  allocator<char> local_31;
  string local_30 [48];
  
  StreamingReporterBase::sectionStarting(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  iVar1 = *(int *)(in_RDI + 0xe0);
  *(int *)(in_RDI + 0xe0) = iVar1 + 1;
  if (0 < iVar1) {
    this_00 = (XmlWriter *)(in_RDI + 0x98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
               (allocator<char> *)in_stack_ffffffffffffff90);
    operator|(Newline,Indent);
    XmlWriter::startElement
              (this_00,in_stack_ffffffffffffff68,
               (XmlFormatting)((ulong)in_stack_ffffffffffffff60 >> 0x20));
    attribute = operator____sr((char *)in_stack_ffffffffffffff60,(size_t)in_stack_ffffffffffffff58);
    StringRef::StringRef((StringRef *)in_stack_ffffffffffffff60,&in_stack_ffffffffffffff58->name);
    SVar2.m_size = (size_type)in_stack_ffffffffffffff90;
    SVar2.m_start = (char *)in_stack_ffffffffffffff88;
    SVar2 = trim(SVar2);
    XmlWriter::writeAttribute((XmlWriter *)SVar2.m_size,in_stack_ffffffffffffffb8,attribute);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator(&local_31);
    writeSourceInfo(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    XmlWriter::ensureTagClosed((XmlWriter *)SVar2.m_start);
  }
  return;
}

Assistant:

void XmlReporter::sectionStarting( SectionInfo const& sectionInfo ) {
        StreamingReporterBase::sectionStarting( sectionInfo );
        if( m_sectionDepth++ > 0 ) {
            m_xml.startElement( "Section" )
                .writeAttribute( "name"_sr, trim( StringRef(sectionInfo.name) ) );
            writeSourceInfo( sectionInfo.lineInfo );
            m_xml.ensureTagClosed();
        }
    }